

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdUpdateTxOutAmount
              (void *handle,int net_type,char *tx_hex_string,uint32_t index,int64_t amount,
              char **tx_string)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  bool is_bitcoin;
  TransactionContext tx;
  allocator local_10a;
  bool local_109;
  string local_108;
  ConfidentialTransactionContext local_e8;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5e44da;
    local_e8.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x5e4
    ;
    local_e8.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x5e4806;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&local_e8.super_ConfidentialTransaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_e8);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string != (char **)0x0) {
    local_109 = false;
    cfd::capi::ConvertNetType(net_type,&local_109);
    if (local_109 == true) {
      std::__cxx11::string::string((string *)&local_108,tx_hex_string,&local_10a);
      cfd::TransactionContext::TransactionContext((TransactionContext *)&local_e8,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      cfd::core::Amount::Amount((Amount *)&local_108,amount);
      cfd::core::Transaction::SetTxOutValue((Transaction *)&local_e8,index,(Amount *)&local_108);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_108,(AbstractTransaction *)&local_e8)
      ;
      pcVar2 = cfd::capi::CreateString(&local_108);
      *tx_string = pcVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      cfd::TransactionContext::~TransactionContext((TransactionContext *)&local_e8);
    }
    else {
      std::__cxx11::string::string((string *)&local_108,tx_hex_string,&local_10a);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&local_e8,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      cfd::core::Amount::Amount((Amount *)&local_108,amount);
      cfd::core::ConfidentialTransaction::SetTxOutValue
                (&local_e8.super_ConfidentialTransaction,index,(Amount *)&local_108);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_108,(AbstractTransaction *)&local_e8)
      ;
      pcVar2 = cfd::capi::CreateString(&local_108);
      *tx_string = pcVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_e8);
    }
    return 0;
  }
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)0x5e44da;
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x5ea;
  local_e8.super_ConfidentialTransaction.vin_.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x5e4806;
  cfd::core::logger::log<>((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,"tx output is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&local_e8.super_ConfidentialTransaction.vin_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"Failed to parameter. tx output is null.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_e8);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdUpdateTxOutAmount(
    void* handle, int net_type, const char* tx_hex_string, uint32_t index,
    int64_t amount, char** tx_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.SetTxOutValue(index, Amount(amount));
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.SetTxOutValue(index, Amount(amount));
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}